

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

int tnt_sbuf_object_grow_stack(tnt_sbuf_object *sbo)

{
  byte bVar1;
  tnt_sbo_stack *ptVar2;
  int iVar3;
  
  iVar3 = -1;
  if (sbo->stack_alloc != 0x80) {
    bVar1 = sbo->stack_alloc * '\x02';
    ptVar2 = (tnt_sbo_stack *)tnt_mem_alloc((ulong)bVar1 << 4);
    if (ptVar2 != (tnt_sbo_stack *)0x0) {
      tnt_mem_free(sbo->stack);
      sbo->stack_alloc = bVar1;
      sbo->stack = ptVar2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
tnt_sbuf_object_grow_stack(struct tnt_sbuf_object *sbo)
{
	if (sbo->stack_alloc == 128) return -1;
	uint8_t new_stack_alloc = 2 * sbo->stack_alloc;
	struct tnt_sbo_stack *stack = tnt_mem_alloc(new_stack_alloc * sizeof(
				struct tnt_sbo_stack));
	if (!stack) return -1;
	tnt_mem_free(sbo->stack);
	sbo->stack_alloc = new_stack_alloc;
	sbo->stack = stack;
	return 0;
}